

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::StoreOffsetInst::useVars(StoreOffsetInst *this)

{
  char *pcVar1;
  int extraout_EDX;
  int __c;
  long in_RSI;
  VarId *__s;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<mir::inst::VarId>,_bool> pVar2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *s;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  _Rb_tree_const_iterator<mir::inst::VarId> in_stack_ffffffffffffff70;
  
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x2c132c);
  __s = (VarId *)(in_RSI + 8);
  pVar2 = std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          ::insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_ffffffffffffff70._M_node,
                   (value_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(in_RSI + 0x20),(char *)__s,pVar2._8_4_);
  __c = extraout_EDX;
  if (pcVar1 == (char *)0x1) {
    __s = std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x2c1388);
    pVar2 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_ffffffffffffff70._M_node,
                   (value_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    __c = pVar2._8_4_;
    in_stack_ffffffffffffff70 = pVar2.first._M_node;
    in_stack_ffffffffffffff6f = pVar2.second;
  }
  pcVar1 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)(in_RSI + 0x40),(char *)__s,__c);
  if (pcVar1 == (char *)0x1) {
    std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x2c1406);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           in_stack_ffffffffffffff70._M_node,
           (value_type *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  }
  return in_RDI;
}

Assistant:

std::set<VarId> useVars()
      const {  // for storeInst,dest is also use(not defined)
    auto s = std::set<VarId>();
    s.insert(dest);
    if (val.index() == 1) {
      s.insert(std::get<VarId>(val));
    }
    if (offset.index() == 1) {
      s.insert(std::get<VarId>(offset));
    }
    return s;
  }